

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bit_count.cpp
# Opt level: O0

void __thiscall BitCount_CountTrailingZeros_Test::TestBody(BitCount_CountTrailingZeros_Test *this)

{
  uint128 x;
  uint128 x_00;
  bool bVar1;
  char *pcVar2;
  unsigned_long x_01;
  undefined8 in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  AssertionResult *this_00;
  AssertHelper local_138;
  Message local_130;
  uint local_128 [2];
  undefined1 local_120 [8];
  AssertionResult gtest_ar_5;
  Message local_108;
  uint local_100 [2];
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_4;
  Message local_e0;
  uint local_d8 [2];
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_3;
  Message local_b8;
  uint local_b0 [2];
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_2;
  Message local_90;
  bit_count *local_88 [3];
  uint local_70 [2];
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  Message local_50 [3];
  bit_count *local_38 [2];
  uint local_28 [2];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  BitCount_CountTrailingZeros_Test *this_local;
  
  local_28[1] = 0x7f;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  pstore::uint128::uint128((uint128 *)local_38,0x8000000000000000,0);
  x.v_._8_8_ = in_stack_fffffffffffffe40;
  x.v_._0_8_ = in_stack_fffffffffffffe38;
  local_28[0] = pstore::bit_count::ctz(local_38[0],x);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_20,"127U",
             "pstore::bit_count::ctz (pstore::uint128{std::uint64_t{1} << 63, 0U})",local_28 + 1,
             local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_count.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_70[1] = 0x3f;
  pstore::uint128::uint128((uint128 *)local_88,0,0x8000000000000000);
  x_00.v_._8_8_ = in_stack_fffffffffffffe40;
  x_00.v_._0_8_ = in_stack_fffffffffffffe38;
  local_70[0] = pstore::bit_count::ctz(local_88[0],x_00);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_68,"63U",
             "pstore::bit_count::ctz (pstore::uint128{0U, std::uint64_t{1} << 63})",local_70 + 1,
             local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_count.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_b0[1] = 0x3f;
  local_b0[0] = pstore::bit_count::ctz(0x8000000000000000);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_a8,"63U","pstore::bit_count::ctz (std::uint64_t{1} << 63)",
             local_b0 + 1,local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_count.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_d8[1] = 0;
  local_d8[0] = pstore::bit_count::ctz(1);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_d0,"0U","pstore::bit_count::ctz (std::uint64_t{1})",local_d8 + 1,
             local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_count.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  local_100[1] = 1;
  local_100[0] = pstore::bit_count::ctz(2);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_f8,"1U","pstore::bit_count::ctz (std::uint64_t{2})",local_100 + 1,
             local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_count.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  local_128[1] = 0;
  x_01 = std::numeric_limits<unsigned_long>::max();
  local_128[0] = pstore::bit_count::ctz(x_01);
  this_00 = (AssertionResult *)local_120;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)this_00,"0U",
             "pstore::bit_count::ctz (std::numeric_limits<std::uint64_t>::max ())",local_128 + 1,
             local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_count.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  return;
}

Assistant:

TEST (BitCount, CountTrailingZeros) {
    EXPECT_EQ (127U, pstore::bit_count::ctz (pstore::uint128{std::uint64_t{1} << 63, 0U}));
    EXPECT_EQ (63U, pstore::bit_count::ctz (pstore::uint128{0U, std::uint64_t{1} << 63}));

    EXPECT_EQ (63U, pstore::bit_count::ctz (std::uint64_t{1} << 63));
    EXPECT_EQ (0U, pstore::bit_count::ctz (std::uint64_t{1}));
    EXPECT_EQ (1U, pstore::bit_count::ctz (std::uint64_t{2}));
    EXPECT_EQ (0U, pstore::bit_count::ctz (std::numeric_limits<std::uint64_t>::max ()));
}